

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O2

void __thiscall index_tree::find(index_tree *this,wstring *content,size_t cursor,int *count)

{
  byte bVar1;
  size_t cursor_local;
  
  cursor_local = cursor;
  set_current_index(this,1);
  this->active_ = true;
  bVar1 = 1;
  while ((bVar1 & 1) != 0) {
    index::find((this->current_index_).super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                content,cursor,&cursor_local,count);
    bVar1 = this->active_;
  }
  return;
}

Assistant:

void index_tree::find(const std::wstring& content, std::size_t cursor, int& count)
{
    std::size_t begin_cursor = cursor;
    // 将当前索引设置为一级索引
    set_current_index(1);

    set_active(true);
    while (active_)
    {
        current_index_->find(content, begin_cursor, cursor, count);
    }
}